

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_depth_pruning_tree_index_impl.h
# Opt level: O1

double __thiscall
ted::
TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
tree_dist(TouzetDepthPruningTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k,int e)

{
  BandMatrix<double> *this_00;
  longlong *plVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pvVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  size_t row;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  size_t row_00;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong extraout_RDX;
  size_t sVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong in_R10;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  double dVar32;
  double dVar33;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar34;
  double dVar35;
  double local_138;
  double local_60 [4];
  undefined8 uStack_40;
  
  uVar15 = (ulong)x;
  iVar3 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15];
  row = (size_t)iVar3;
  uVar4 = (t2->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[y];
  this_00 = &(this->
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             ).
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_;
  pdVar12 = data_structures::Matrix<double>::at
                      (&this_00->super_Matrix<double>,0,
                       (this->
                       super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       ).
                       super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                       .fd_.band_width_);
  *pdVar12 = 0.0;
  uVar11 = e;
  if ((int)uVar4 < e) {
    uVar11 = uVar4;
  }
  uVar34 = extraout_XMM0_Qb;
  if (0 < (int)uVar11) {
    uVar30 = 1;
    do {
      pdVar12 = data_structures::Matrix<double>::read_at
                          (&this_00->super_Matrix<double>,0,
                           (uVar30 + (this->
                                     super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                     ).
                                     super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                     .fd_.band_width_) - 1);
      dVar32 = *pdVar12;
      pdVar12 = data_structures::Matrix<double>::at
                          (&this_00->super_Matrix<double>,0,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ + uVar30);
      uVar34 = 0;
      *pdVar12 = dVar32 + 1.0;
      uVar30 = uVar30 + 1;
    } while (uVar11 + 1 != uVar30);
  }
  if (e < (int)uVar4) {
    pdVar12 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,0,
                         (long)e + (this->
                                   super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   .fd_.band_width_ + 1);
    *pdVar12 = INFINITY;
    uVar34 = extraout_XMM0_Qb_00;
  }
  iVar24 = e;
  if (iVar3 < e) {
    iVar24 = iVar3;
  }
  if (0 < iVar24) {
    sVar20 = 1;
    do {
      pdVar12 = data_structures::Matrix<double>::read_at
                          (&this_00->super_Matrix<double>,sVar20 - 1,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ - (sVar20 - 1));
      dVar32 = *pdVar12;
      pdVar12 = data_structures::Matrix<double>::at
                          (&this_00->super_Matrix<double>,sVar20,
                           (this->
                           super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           ).
                           super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                           .fd_.band_width_ - sVar20);
      uVar34 = 0;
      *pdVar12 = dVar32 + 1.0;
      sVar20 = sVar20 + 1;
    } while (sVar20 != iVar24 + 1);
  }
  if (e < iVar3) {
    pdVar12 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,(long)(e + 1),
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_ - (long)(e + 1));
    *pdVar12 = INFINITY;
    uVar34 = extraout_XMM0_Qb_01;
  }
  piVar6 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar19 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar6 >> 2;
  uVar30 = uVar19;
  uVar16 = uVar15;
  if (uVar15 < uVar19) {
    piVar7 = (t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar30 = (long)(t1->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar7 >> 2;
    if (uVar15 < uVar30) {
      iVar23 = e + piVar6[uVar15] + 1;
      iVar24 = piVar7[uVar15];
      if (iVar24 < iVar23) {
        iVar23 = iVar24;
      }
      uVar26 = (ulong)iVar23;
      pvVar8 = (t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
               -0x5555555555555555;
      uVar30 = uVar13;
      uVar16 = uVar26;
      in_R10 = uVar26;
      if (uVar26 <= uVar13 && uVar13 - uVar26 != 0) {
        lVar28 = uVar15 - row;
        lVar31 = *(long *)&pvVar8[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar22 = (long)*(pointer *)
                        ((long)&pvVar8[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                        + 8) - lVar31 >> 2;
        uVar25 = 0;
        do {
          uVar30 = uVar22;
          uVar16 = uVar22;
          if (uVar22 == uVar25) break;
          iVar24 = *(int *)(lVar31 + uVar25 * 4);
          iVar27 = (int)lVar28;
          iVar21 = iVar24 - iVar27;
          if (iVar21 != 0 && iVar27 <= iVar24) {
            uVar30 = uVar19;
            uVar16 = lVar28 + 1U;
            if (lVar28 + 1U < uVar19) {
              if (piVar6[lVar28 + 1] <= iVar23) {
                iVar21 = 1;
              }
              local_60[3] = (double)e;
              uStack_40 = uVar34;
              if (iVar3 < iVar21) goto LAB_0010bc18;
              iVar24 = (int)uVar25 + (uint)(iVar23 <= piVar6[lVar28 + 1]);
              goto LAB_0010bda5;
            }
            break;
          }
          uVar25 = uVar25 + 1;
          uVar30 = uVar13;
          uVar16 = uVar26;
        } while (uVar26 <= uVar13 && uVar13 - uVar26 != 0);
      }
    }
  }
LAB_0010c24a:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16,
               uVar30);
    uVar30 = extraout_RDX;
    uVar16 = in_R10;
  } while( true );
LAB_0010bda5:
  sVar20 = (size_t)iVar21;
  if (e - iVar21 < -1) {
    pdVar12 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,sVar20,
                         ((long)(~e + iVar21) - sVar20) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    *pdVar12 = INFINITY;
  }
  uVar11 = iVar21 - e;
  if ((int)uVar11 < 2) {
    uVar11 = 1;
  }
  uVar18 = e + iVar21;
  uVar10 = uVar18;
  if ((int)uVar4 < (int)uVar18) {
    uVar10 = uVar4;
  }
  if ((int)uVar11 <= (int)uVar10) {
    row_00 = (size_t)(iVar27 + iVar21);
    uVar16 = (ulong)(iVar27 + -1 + iVar21);
    uVar19 = (ulong)uVar11;
    iVar29 = ((((x + uVar4) - iVar3) - y) + iVar21) - uVar11;
    do {
      if ((iVar21 == iVar3) && (uVar10 == uVar19)) break;
      plVar1 = &(this->
                super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                .subproblem_counter_;
      *plVar1 = *plVar1 + 1;
      iVar5 = -iVar29;
      if (0 < iVar29) {
        iVar5 = iVar29;
      }
      sVar9 = (this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .fd_.band_width_;
      if (k < iVar5) {
        pdVar12 = data_structures::Matrix<double>::at
                            (&this_00->super_Matrix<double>,sVar20,sVar9 + -sVar20 + uVar19);
        *pdVar12 = INFINITY;
      }
      else {
        lVar31 = -sVar20 + uVar19;
        pdVar12 = data_structures::Matrix<double>::read_at
                            (&this_00->super_Matrix<double>,sVar20,(sVar9 + lVar31) - 1);
        lVar28 = (long)(int)((y - uVar4) + (int)uVar19);
        dVar32 = *pdVar12 + 1.0;
        if (INFINITY <= dVar32) {
          dVar32 = INFINITY;
        }
        pdVar12 = data_structures::Matrix<double>::read_at
                            (&(this->
                              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              ).
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                              .td_.super_Matrix<double>,row_00,
                             (lVar28 - row_00) +
                             (this->
                             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ).
                             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             .td_.band_width_);
        dVar2 = *pdVar12;
        iVar5 = (t1->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>
                ._M_impl.super__Vector_impl_data._M_start[row_00];
        if ((iVar21 != iVar5) ||
           (dVar33 = 0.0,
           uVar19 != (uint)(t2->super_PostLToSize).postl_to_size_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28])) {
          lVar28 = (long)(t2->super_PostLToSize).postl_to_size_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28];
          lVar17 = uVar19 - lVar28;
          uVar11 = ~(e + iVar5) + iVar21;
          uVar30 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar30 = 0;
          }
          dVar33 = INFINITY;
          if ((long)uVar30 <= lVar17) {
            uVar11 = e + 1 + (iVar21 - iVar5);
            if ((int)uVar4 < (int)uVar11) {
              uVar11 = uVar4;
            }
            dVar33 = INFINITY;
            if (lVar17 <= (int)uVar11) {
              pdVar12 = data_structures::Matrix<double>::read_at
                                  (&this_00->super_Matrix<double>,(long)(iVar21 - iVar5),
                                   (((long)iVar5 +
                                    (this->
                                    super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    ).
                                    super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                    .fd_.band_width_) - lVar28) + lVar31);
              dVar33 = *pdVar12;
            }
          }
        }
        dVar35 = dVar2 + dVar33;
        if (dVar32 <= dVar2 + dVar33) {
          dVar35 = dVar32;
        }
        local_138 = dVar35;
        if (iVar21 == 1) {
LAB_0010c037:
          pdVar12 = data_structures::Matrix<double>::read_at
                              (&this_00->super_Matrix<double>,(long)(iVar21 + -1),
                               (uVar19 - (long)(iVar21 + -1)) +
                               (this->
                               super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               ).
                               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               .fd_.band_width_);
          local_138 = *pdVar12 + 1.0;
          if (dVar35 <= *pdVar12 + 1.0) {
            local_138 = dVar35;
          }
        }
        else if (1 < iVar21) {
          piVar6 = (t1->super_PostLToDepth).postl_to_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar30 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
          if (uVar30 <= uVar16) goto LAB_0010c24a;
          if (piVar6[uVar16] - piVar6[uVar15] <= e + 1) goto LAB_0010c037;
        }
        pdVar12 = data_structures::Matrix<double>::at
                            (&this_00->super_Matrix<double>,sVar20,
                             lVar31 + (this->
                                      super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                      ).
                                      super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                      .fd_.band_width_);
        if (local_138 <= local_60[3]) {
          *pdVar12 = local_138;
        }
        else {
          *pdVar12 = INFINITY;
        }
      }
      uVar19 = uVar19 + 1;
      iVar29 = iVar29 + -1;
    } while (uVar10 + 1 != uVar19);
  }
  if ((int)uVar18 < (int)uVar4) {
    pdVar12 = data_structures::Matrix<double>::at
                        (&this_00->super_Matrix<double>,sVar20,
                         ((long)(int)(uVar18 + 1) - sVar20) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    *pdVar12 = INFINITY;
  }
  iVar29 = iVar21 + 1;
  if (iVar21 < iVar3) {
    uVar16 = (ulong)(iVar29 + iVar27);
    piVar6 = (t1->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar30 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar6 >> 2;
    in_R10 = uVar26;
    if (uVar30 <= uVar16) goto LAB_0010c24a;
    if (iVar23 < piVar6[uVar16]) {
      pvVar8 = (t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar30 = ((long)(t1->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
               -0x5555555555555555;
      uVar16 = uVar26;
      if (uVar30 < uVar26 || uVar30 - uVar26 == 0) goto LAB_0010c24a;
      uVar16 = (ulong)iVar24;
      lVar31 = *(long *)&pvVar8[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      uVar30 = (long)*(pointer *)
                      ((long)&pvVar8[uVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      8) - lVar31 >> 2;
      if (uVar30 <= uVar16) goto LAB_0010c24a;
      iVar24 = iVar24 + 1;
      iVar29 = *(int *)(lVar31 + uVar16 * 4) - iVar27;
    }
    else if (iVar21 < iVar3) {
      piVar6 = (t1->super_PostLToDepth).postl_to_depth_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar30 = (long)(t1->super_PostLToDepth).postl_to_depth_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)piVar6 >> 2;
      if (uVar30 <= uVar16) goto LAB_0010c24a;
      iVar24 = iVar24 + (uint)(piVar6[uVar16] == iVar23);
    }
  }
  iVar21 = iVar29;
  if (iVar3 < iVar21) {
LAB_0010bc18:
    plVar1 = &(this->
              super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              ).
              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .
              super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              .subproblem_counter_;
    *plVar1 = *plVar1 + 1;
    sVar20 = row - 1;
    pdVar12 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,sVar20,
                         ((long)(int)uVar4 - sVar20) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    local_60[0] = *pdVar12 + 1.0;
    lVar31 = (long)(int)uVar4 + -1;
    pdVar12 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,row,
                         (lVar31 - row) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    local_60[1] = *pdVar12 + 1.0;
    pdVar12 = data_structures::Matrix<double>::read_at
                        (&this_00->super_Matrix<double>,sVar20,
                         (lVar31 - sVar20) +
                         (this->
                         super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         .fd_.band_width_);
    dVar32 = 0.0;
    if ((t1->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar15] !=
        (t2->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[y]) {
      dVar32 = 1.0;
    }
    pdVar14 = local_60;
    local_60[2] = dVar32 + *pdVar12;
    lVar31 = 8;
    do {
      if (*(double *)((long)local_60 + lVar31) <= *pdVar14 &&
          *pdVar14 != *(double *)((long)local_60 + lVar31)) {
        pdVar14 = (double *)((long)local_60 + lVar31);
      }
      lVar31 = lVar31 + 8;
    } while (lVar31 != 0x18);
    uVar15 = -(ulong)(local_60[3] < *pdVar14);
    return (double)(~uVar15 & (ulong)*pdVar14 | uVar15 & 0x7ff0000000000000);
  }
  goto LAB_0010bda5;
}

Assistant:

double TouzetDepthPruningTreeIndex<CostModel, TreeIndex>::tree_dist(
    const TreeIndex& t1, const TreeIndex& t2, const int x,
    const int y, const int k, const int e) {
  int x_size = t1.postl_to_size_[x];
  int y_size = t2.postl_to_size_[y];
  
  // std::cout << "TouzetDepthPruningTreeIndex::tree_dist" << std::endl;
  
  // Calculates offsets that let us translate i and j to correct postorder ids.
  int x_off = x - x_size;
  int y_off = y - y_size;

  // Initial cases.
  fd_.at(0, 0) = 0.0; // (0,0) is always within e-strip.
  for (int j = 1; j <= std::min(y_size, e); ++j) { // i = 0; only j that are within e-strip.
    fd_.at(0, j) = fd_.read_at(0, j - 1) + c_.ins(t2.postl_to_label_id_[j + y_off]);
  }
  if (e + 1 <= y_size) { // the first j that is outside e-strip
    fd_.at(0, e + 1) = std::numeric_limits<double>::infinity();
  }
  // QUESTION: Is it necessary to verify depths here?
  //           It is not, because these values will never be used. We write
  //           them not to verify the condition.
  for (int i = 1; i <= std::min(x_size, e); ++i) { // j = 0; only i that are within e-strip.
    fd_.at(i, 0) = fd_.read_at(i - 1, 0) + c_.del(t1.postl_to_label_id_[i + x_off]);
  }
  if (e + 1 <= x_size) { // the first i that is outside e-strip
    fd_.at(e + 1, 0) = std::numeric_limits<double>::infinity();
  }

  double candidate_result = std::numeric_limits<double>::infinity();

  // General cases.

  // NOTE: max_depth has to be set to min(depth(x)+e+1, max depth of T1_x)
  //       because e+1 may exceed the maximum depth of T1_x.
  // TODO: Figure out why e+1.
  int max_depth = std::min(t1.postl_to_depth_.at(x) + e + 1, t1.postl_to_subtree_max_depth_.at(x));

  int i = 1;
  int max_depth_it = 0;
  // Move max_depth_it to point to the first node within this subtree (T1_x).
  // TODO: This requires a scan of one depth inversted list. Can we do better?
  while (t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) < i + x_off) {
    ++max_depth_it;
  }
  // Set the first i-value for the loop
  // TODO: Make this if more elegant.
  if (t1.postl_to_depth_.at(i + x_off) > max_depth) {
    // x_off has to be substructed to get correct i.
    i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
    ++max_depth_it;
  } else if (t1.postl_to_depth_.at(i + x_off) == max_depth) {
    ++max_depth_it;
  }
  // Traversing truncated tree to filter out i-values based on depth.
  while (i <= x_size) {
    // Old if statement for filtering i-values based on depth.
    // if (t1_depth_[i + x_off] - t1_depth_[x] > e + 1) { continue; }
    if (i - e - 1 >= 1) { // First j that is outside e-strip.
      fd_.at(i, i - e - 1) = std::numeric_limits<double>::infinity();
    }
    for (int j = std::max(1, i - e); j <= std::min(i + e, y_size); ++j) { // only (i,j) that are in e-strip
      // The td(x_size-1, y_size-1) is computed differently.
      // TODO: This condition is evaluated too often but passes only on the
      //       last i and j.
      if (i == x_size && j == std::min(i + e, y_size)) {
        break;
      }
      ++subproblem_counter_;
      if (std::abs((i + x_off) - (j + y_off)) > k) {
        fd_.at(i, j) = std::numeric_limits<double>::infinity();
      } else {
        candidate_result = std::numeric_limits<double>::infinity();
        candidate_result = std::min(candidate_result, fd_.read_at(i, j - 1) +
            c_.ins(t2.postl_to_label_id_[j + y_off]));
        double td_read = td_.read_at(i + x_off, j + y_off);
        double fd_read = 0.0;
        // If one of the forests is a tree, look up the vlaues in fd_.
        // Otherwise, both forests are trees and the fd-part is empty.
        if (i - t1.postl_to_size_[i + x_off] != 0 || j - t2.postl_to_size_[j + y_off] != 0) {
          // If the values to read are outside of the band, they exceed
          // the threshold or are not present in the band-matrix.
          if (j - t2.postl_to_size_[j + y_off] < std::max(0, i - t1.postl_to_size_[i + x_off] - e - 1)) {
            fd_read = std::numeric_limits<double>::infinity();
          } else if (std::min(i - t1.postl_to_size_[i + x_off] + e + 1, y_size) < j - t2.postl_to_size_[j + y_off]) {
            fd_read = std::numeric_limits<double>::infinity();
          } else {
            fd_read = fd_.read_at(i - t1.postl_to_size_[i + x_off], j - t2.postl_to_size_[j + y_off]);
          }
        }
        candidate_result = std::min(candidate_result, fd_read + td_read);

        // Value at (i-1,j) may not be calculated due to truncated tree,
        // thus it has to be verified separately.
        // NOTE: For i=1 there may be an out of bound exception for depth
        //       lookup.
        if (i == 1 || (i > 1 && t1.postl_to_depth_.at(i - 1 + x_off) - t1.postl_to_depth_[x] <= e + 1)) {
          candidate_result = std::min(
            candidate_result,
            fd_.read_at(i - 1, j) + c_.del(t1.postl_to_label_id_[i + x_off])
          );
        }

        // None of the values in fd_ can be greater than e-value for this
        // subtree pair.
        if (candidate_result > e) {
          fd_.at(i, j) = std::numeric_limits<double>::infinity();
        } else {
          fd_.at(i, j) = candidate_result;
        }
      }
    }
    if (i + e + 1 <= y_size) { // Last j that is outside e-strip.
      fd_.at(i, i + e + 1) = std::numeric_limits<double>::infinity();
    }
    // Set next i to iterate.
    ++i;
    // NOTE: i <= x_size verifies depth and dil[max_depth] bounds.
    // NOTE: For i=x_size (subtree root) the depth is always smaller than
    //       max_depth.
    // TODO: Make this if more elegant.
    if (i <= x_size && t1.postl_to_depth_.at(i + x_off) > max_depth) {
      // If depth of i is greater than max_depth, there must be an ancestor
      // of i with depth equals max_depth, and max_depth_it points to it.
      // x_off has to be substructed to get correct i.
      i = t1.inverted_list_depth_to_postl_.at(max_depth).at(max_depth_it) - x_off;
      ++max_depth_it;
    } else if (i <= x_size && t1.postl_to_depth_.at(i + x_off) == max_depth) {
      ++max_depth_it;
    }
  }
  
  ++subproblem_counter_;
  // QUESTION: Is it possible that for some e-value an infinity should be
  //           returned, because the last subproblem is too far away?
  candidate_result = std::min({
    fd_.read_at(x_size - 1, y_size) + c_.del(t1.postl_to_label_id_[x]),                 // Delete root in source subtree.
    fd_.read_at(x_size, y_size - 1) + c_.ins(t2.postl_to_label_id_[y]),                 // Insert root in destination subtree.
    fd_.read_at(x_size - 1, y_size - 1) + c_.ren(t1.postl_to_label_id_[x], t2.postl_to_label_id_[y]) // Rename root nodes of the subtrees.
  });
  // The distance between two subtrees cannot be greater than e-value for these
  // subtrees.
  if (candidate_result > e) {
    return std::numeric_limits<double>::infinity();
  } else {
    return candidate_result;
  }
}